

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase82::run(TestCase82 *this)

{
  char16_t *pcVar1;
  undefined1 in_R8B;
  size_t sVar2;
  EncodingResult<kj::Array<char16_t>_> local_478;
  EncodingResult<kj::Array<char16_t>_> local_458;
  EncodingResult<kj::Array<char16_t>_> local_438;
  EncodingResult<kj::Array<char16_t>_> local_418;
  EncodingResult<kj::Array<char16_t>_> local_3f8;
  EncodingResult<kj::Array<char16_t>_> local_3d8;
  EncodingResult<kj::Array<char16_t>_> local_3b8;
  EncodingResult<kj::Array<char16_t>_> local_398;
  EncodingResult<kj::Array<char16_t>_> local_378;
  EncodingResult<kj::Array<char16_t>_> local_358;
  EncodingResult<kj::Array<char16_t>_> local_338;
  EncodingResult<kj::Array<char16_t>_> local_318;
  EncodingResult<kj::Array<char16_t>_> local_2f8;
  EncodingResult<kj::Array<char16_t>_> local_2d8;
  EncodingResult<kj::Array<char16_t>_> local_2b8;
  EncodingResult<kj::Array<char16_t>_> local_298;
  EncodingResult<kj::Array<char16_t>_> local_278;
  EncodingResult<kj::Array<char16_t>_> local_258;
  EncodingResult<kj::Array<char16_t>_> local_238;
  EncodingResult<kj::Array<char16_t>_> local_218;
  EncodingResult<kj::Array<char16_t>_> local_1f8;
  EncodingResult<kj::Array<char16_t>_> local_1d8;
  EncodingResult<kj::Array<char16_t>_> local_1b8;
  EncodingResult<kj::Array<char16_t>_> local_198;
  EncodingResult<kj::Array<char16_t>_> local_178;
  EncodingResult<kj::Array<char16_t>_> local_158;
  EncodingResult<kj::Array<char16_t>_> local_138;
  EncodingResult<kj::Array<char16_t>_> local_118;
  EncodingResult<kj::Array<char16_t>_> local_f8;
  EncodingResult<kj::Array<char16_t>_> local_d8;
  EncodingResult<kj::Array<char16_t>_> local_b8;
  EncodingResult<kj::Array<char16_t>_> local_98;
  EncodingResult<kj::Array<char16_t>_> local_78;
  EncodingResult<kj::Array<char16_t>_> local_58;
  EncodingResult<kj::Array<char16_t>_> local_38;
  
  encodeUtf16(&local_38,(kj *)(anon_var_dwarf_189c27 + 7),(ArrayPtr<const_char>)ZEXT816(1),
              (bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_38,(char16_t (*) [2])(anon_var_dwarf_189cbf + 1),true);
  sVar2 = local_38.super_Array<char16_t>.size_;
  pcVar1 = local_38.super_Array<char16_t>.ptr;
  if (local_38.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_38.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_38.super_Array<char16_t>.size_ = 0;
    (**(local_38.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_38.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_58,(kj *)anon_var_dwarf_189a8b,(ArrayPtr<const_char>)ZEXT816(3),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,4ul>
            (&local_58,&anon_var_dwarf_189a95,true);
  sVar2 = local_58.super_Array<char16_t>.size_;
  pcVar1 = local_58.super_Array<char16_t>.ptr;
  if (local_58.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_58.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_58.super_Array<char16_t>.size_ = 0;
    (**(local_58.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_58.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_78,(kj *)anon_var_dwarf_189a9f,(ArrayPtr<const_char>)ZEXT816(5),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,4ul>
            (&local_78,&anon_var_dwarf_189a95,true);
  sVar2 = local_78.super_Array<char16_t>.size_;
  pcVar1 = local_78.super_Array<char16_t>.ptr;
  if (local_78.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_78.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_78.super_Array<char16_t>.size_ = 0;
    (**(local_78.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_78.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_98,(kj *)anon_var_dwarf_189ab5,(ArrayPtr<const_char>)ZEXT816(2),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_98,&anon_var_dwarf_189acb,true);
  sVar2 = local_98.super_Array<char16_t>.size_;
  pcVar1 = local_98.super_Array<char16_t>.ptr;
  if (local_98.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_98.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_98.super_Array<char16_t>.size_ = 0;
    (**(local_98.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_98.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_b8,(kj *)anon_var_dwarf_189ae1,(ArrayPtr<const_char>)ZEXT816(2),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_b8,&anon_var_dwarf_189acb,true);
  sVar2 = local_b8.super_Array<char16_t>.size_;
  pcVar1 = local_b8.super_Array<char16_t>.ptr;
  if (local_b8.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_b8.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_b8.super_Array<char16_t>.size_ = 0;
    (**(local_b8.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_b8.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_d8,(kj *)anon_var_dwarf_189aeb,(ArrayPtr<const_char>)ZEXT816(3),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_d8,&anon_var_dwarf_189acb,true);
  sVar2 = local_d8.super_Array<char16_t>.size_;
  pcVar1 = local_d8.super_Array<char16_t>.ptr;
  if (local_d8.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_d8.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_d8.super_Array<char16_t>.size_ = 0;
    (**(local_d8.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_d8.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_f8,(kj *)anon_var_dwarf_189af5,(ArrayPtr<const_char>)ZEXT816(2),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_f8,&anon_var_dwarf_189acb,true);
  sVar2 = local_f8.super_Array<char16_t>.size_;
  pcVar1 = local_f8.super_Array<char16_t>.ptr;
  if (local_f8.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_f8.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_f8.super_Array<char16_t>.size_ = 0;
    (**(local_f8.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_f8.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_118,(kj *)anon_var_dwarf_189aff,(ArrayPtr<const_char>)ZEXT816(3),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_118,&anon_var_dwarf_189acb,true);
  sVar2 = local_118.super_Array<char16_t>.size_;
  pcVar1 = local_118.super_Array<char16_t>.ptr;
  if (local_118.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_118.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_118.super_Array<char16_t>.size_ = 0;
    (**(local_118.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_118.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_138,(kj *)anon_var_dwarf_189b09,(ArrayPtr<const_char>)ZEXT816(4),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_138,&anon_var_dwarf_189acb,true);
  sVar2 = local_138.super_Array<char16_t>.size_;
  pcVar1 = local_138.super_Array<char16_t>.ptr;
  if (local_138.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_138.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_138.super_Array<char16_t>.size_ = 0;
    (**(local_138.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_138.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_158,(kj *)anon_var_dwarf_189b1f,(ArrayPtr<const_char>)ZEXT816(2),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_158,(char16_t (*) [2])(anon_var_dwarf_189cbf + 1),true);
  sVar2 = local_158.super_Array<char16_t>.size_;
  pcVar1 = local_158.super_Array<char16_t>.ptr;
  if (local_158.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_158.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_158.super_Array<char16_t>.size_ = 0;
    (**(local_158.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_158.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_178,(kj *)anon_var_dwarf_189b29,(ArrayPtr<const_char>)ZEXT816(2),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_178,(char16_t (*) [2])(anon_var_dwarf_189cbf + 1),true);
  sVar2 = local_178.super_Array<char16_t>.size_;
  pcVar1 = local_178.super_Array<char16_t>.ptr;
  if (local_178.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_178.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_178.super_Array<char16_t>.size_ = 0;
    (**(local_178.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_178.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_198,(kj *)anon_var_dwarf_189b33,(ArrayPtr<const_char>)ZEXT816(2),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_198,(char16_t (*) [2])L"\x80",false);
  sVar2 = local_198.super_Array<char16_t>.size_;
  pcVar1 = local_198.super_Array<char16_t>.ptr;
  if (local_198.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_198.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_198.super_Array<char16_t>.size_ = 0;
    (**(local_198.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_198.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_1b8,(kj *)anon_var_dwarf_189b47,(ArrayPtr<const_char>)ZEXT816(2),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_1b8,(char16_t (*) [2])L"߿",false);
  sVar2 = local_1b8.super_Array<char16_t>.size_;
  pcVar1 = local_1b8.super_Array<char16_t>.ptr;
  if (local_1b8.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_1b8.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_1b8.super_Array<char16_t>.size_ = 0;
    (**(local_1b8.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_1b8.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_1d8,(kj *)anon_var_dwarf_189b5b,(ArrayPtr<const_char>)ZEXT816(3),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_1d8,(char16_t (*) [2])(anon_var_dwarf_189cbf + 1),true);
  sVar2 = local_1d8.super_Array<char16_t>.size_;
  pcVar1 = local_1d8.super_Array<char16_t>.ptr;
  if (local_1d8.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_1d8.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_1d8.super_Array<char16_t>.size_ = 0;
    (**(local_1d8.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_1d8.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_1f8,(kj *)anon_var_dwarf_189b65,(ArrayPtr<const_char>)ZEXT816(3),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_1f8,(char16_t (*) [2])(anon_var_dwarf_189cbf + 1),true);
  sVar2 = local_1f8.super_Array<char16_t>.size_;
  pcVar1 = local_1f8.super_Array<char16_t>.ptr;
  if (local_1f8.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_1f8.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_1f8.super_Array<char16_t>.size_ = 0;
    (**(local_1f8.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_1f8.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_218,(kj *)anon_var_dwarf_189b6f,(ArrayPtr<const_char>)ZEXT816(3),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_218,(char16_t (*) [2])L"ࠀ",false);
  sVar2 = local_218.super_Array<char16_t>.size_;
  pcVar1 = local_218.super_Array<char16_t>.ptr;
  if (local_218.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_218.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_218.super_Array<char16_t>.size_ = 0;
    (**(local_218.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_218.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_238,(kj *)anon_var_dwarf_189b83,(ArrayPtr<const_char>)ZEXT816(3),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_238,(char16_t (*) [2])L"",false);
  sVar2 = local_238.super_Array<char16_t>.size_;
  pcVar1 = local_238.super_Array<char16_t>.ptr;
  if (local_238.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_238.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_238.super_Array<char16_t>.size_ = 0;
    (**(local_238.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_238.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_258,(kj *)anon_var_dwarf_189b97,(ArrayPtr<const_char>)ZEXT816(3),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_258,(char16_t (*) [2])L"\xffff",false);
  sVar2 = local_258.super_Array<char16_t>.size_;
  pcVar1 = local_258.super_Array<char16_t>.ptr;
  if (local_258.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_258.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_258.super_Array<char16_t>.size_ = 0;
    (**(local_258.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_258.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_278,(kj *)anon_var_dwarf_189bab,(ArrayPtr<const_char>)ZEXT816(4),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_278,(char16_t (*) [2])(anon_var_dwarf_189cbf + 1),true);
  sVar2 = local_278.super_Array<char16_t>.size_;
  pcVar1 = local_278.super_Array<char16_t>.ptr;
  if (local_278.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_278.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_278.super_Array<char16_t>.size_ = 0;
    (**(local_278.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_278.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_298,(kj *)anon_var_dwarf_189bb5,(ArrayPtr<const_char>)ZEXT816(4),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_298,(char16_t (*) [2])(anon_var_dwarf_189cbf + 1),true);
  sVar2 = local_298.super_Array<char16_t>.size_;
  pcVar1 = local_298.super_Array<char16_t>.ptr;
  if (local_298.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_298.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_298.super_Array<char16_t>.size_ = 0;
    (**(local_298.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_298.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_2b8,(kj *)anon_var_dwarf_189bbf,(ArrayPtr<const_char>)ZEXT816(4),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_2b8,(char16_t (*) [3])L"𐀀",false);
  sVar2 = local_2b8.super_Array<char16_t>.size_;
  pcVar1 = local_2b8.super_Array<char16_t>.ptr;
  if (local_2b8.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_2b8.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_2b8.super_Array<char16_t>.size_ = 0;
    (**(local_2b8.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_2b8.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_2d8,(kj *)anon_var_dwarf_189bd3,(ArrayPtr<const_char>)ZEXT816(4),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_2d8,(char16_t (*) [3])L"\x0010ffff",false);
  sVar2 = local_2d8.super_Array<char16_t>.size_;
  pcVar1 = local_2d8.super_Array<char16_t>.ptr;
  if (local_2d8.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_2d8.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_2d8.super_Array<char16_t>.size_ = 0;
    (**(local_2d8.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_2d8.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_2f8,(kj *)anon_var_dwarf_189be7,(ArrayPtr<const_char>)ZEXT816(4),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_2f8,(char16_t (*) [2])(anon_var_dwarf_189cbf + 1),true);
  sVar2 = local_2f8.super_Array<char16_t>.size_;
  pcVar1 = local_2f8.super_Array<char16_t>.ptr;
  if (local_2f8.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_2f8.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_2f8.super_Array<char16_t>.size_ = 0;
    (**(local_2f8.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_2f8.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_318,(kj *)anon_var_dwarf_189bf1,(ArrayPtr<const_char>)ZEXT816(5),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_318,(char16_t (*) [2])(anon_var_dwarf_189cbf + 1),true);
  sVar2 = local_318.super_Array<char16_t>.size_;
  pcVar1 = local_318.super_Array<char16_t>.ptr;
  if (local_318.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_318.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_318.super_Array<char16_t>.size_ = 0;
    (**(local_318.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_318.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_338,(kj *)anon_var_dwarf_189bfb,(ArrayPtr<const_char>)ZEXT816(6),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_338,(char16_t (*) [2])(anon_var_dwarf_189cbf + 1),true);
  sVar2 = local_338.super_Array<char16_t>.size_;
  pcVar1 = local_338.super_Array<char16_t>.ptr;
  if (local_338.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_338.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_338.super_Array<char16_t>.size_ = 0;
    (**(local_338.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_338.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_358,(kj *)anon_var_dwarf_189c11,(ArrayPtr<const_char>)ZEXT816(7),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_358,(char16_t (*) [2])(anon_var_dwarf_189cbf + 1),true);
  sVar2 = local_358.super_Array<char16_t>.size_;
  pcVar1 = local_358.super_Array<char16_t>.ptr;
  if (local_358.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_358.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_358.super_Array<char16_t>.size_ = 0;
    (**(local_358.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_358.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_378,(kj *)anon_var_dwarf_189c27,(ArrayPtr<const_char>)ZEXT816(8),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_378,(char16_t (*) [2])(anon_var_dwarf_189cbf + 1),true);
  sVar2 = local_378.super_Array<char16_t>.size_;
  pcVar1 = local_378.super_Array<char16_t>.ptr;
  if (local_378.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_378.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_378.super_Array<char16_t>.size_ = 0;
    (**(local_378.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_378.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_398,(kj *)anon_var_dwarf_189c3d,(ArrayPtr<const_char>)ZEXT816(6),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_398,&anon_var_dwarf_189c47,true);
  sVar2 = local_398.super_Array<char16_t>.size_;
  pcVar1 = local_398.super_Array<char16_t>.ptr;
  if (local_398.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_398.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_398.super_Array<char16_t>.size_ = 0;
    (**(local_398.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_398.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_3b8,(kj *)anon_var_dwarf_189c51,(ArrayPtr<const_char>)ZEXT816(6),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_3b8,&anon_var_dwarf_189c5b,true);
  sVar2 = local_3b8.super_Array<char16_t>.size_;
  pcVar1 = local_3b8.super_Array<char16_t>.ptr;
  if (local_3b8.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_3b8.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_3b8.super_Array<char16_t>.size_ = 0;
    (**(local_3b8.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_3b8.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_3d8,(kj *)anon_var_dwarf_189c65,(ArrayPtr<const_char>)ZEXT816(6),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_3d8,&anon_var_dwarf_189c6f,true);
  sVar2 = local_3d8.super_Array<char16_t>.size_;
  pcVar1 = local_3d8.super_Array<char16_t>.ptr;
  if (local_3d8.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_3d8.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_3d8.super_Array<char16_t>.size_ = 0;
    (**(local_3d8.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_3d8.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_3f8,(kj *)anon_var_dwarf_189c79,(ArrayPtr<const_char>)ZEXT816(4),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_3f8,&anon_var_dwarf_189c83,true);
  sVar2 = local_3f8.super_Array<char16_t>.size_;
  pcVar1 = local_3f8.super_Array<char16_t>.ptr;
  if (local_3f8.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_3f8.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_3f8.super_Array<char16_t>.size_ = 0;
    (**(local_3f8.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_3f8.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_418,(kj *)anon_var_dwarf_189c8d,(ArrayPtr<const_char>)ZEXT816(5),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,4ul>
            (&local_418,&anon_var_dwarf_189c97,true);
  sVar2 = local_418.super_Array<char16_t>.size_;
  pcVar1 = local_418.super_Array<char16_t>.ptr;
  if (local_418.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_418.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_418.super_Array<char16_t>.size_ = 0;
    (**(local_418.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_418.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_438,(kj *)anon_var_dwarf_189ca1,(ArrayPtr<const_char>)ZEXT816(8),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,5ul>
            (&local_438,&anon_var_dwarf_189cab,true);
  sVar2 = local_438.super_Array<char16_t>.size_;
  pcVar1 = local_438.super_Array<char16_t>.ptr;
  if (local_438.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_438.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_438.super_Array<char16_t>.size_ = 0;
    (**(local_438.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_438.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_458,(kj *)anon_var_dwarf_189cb5,(ArrayPtr<const_char>)ZEXT816(6),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_458,&anon_var_dwarf_189cbf,true);
  sVar2 = local_458.super_Array<char16_t>.size_;
  pcVar1 = local_458.super_Array<char16_t>.ptr;
  if (local_458.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_458.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_458.super_Array<char16_t>.size_ = 0;
    (**(local_458.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_458.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
    in_R8B = (undefined1)sVar2;
  }
  encodeUtf16(&local_478,(kj *)anon_var_dwarf_189cc9,(ArrayPtr<const_char>)ZEXT816(6),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_478,&anon_var_dwarf_189cd3,true);
  sVar2 = local_478.super_Array<char16_t>.size_;
  pcVar1 = local_478.super_Array<char16_t>.ptr;
  if (local_478.super_Array<char16_t>.ptr != (char16_t *)0x0) {
    local_478.super_Array<char16_t>.ptr = (char16_t *)0x0;
    local_478.super_Array<char16_t>.size_ = 0;
    (**(local_478.super_Array<char16_t>.disposer)->_vptr_ArrayDisposer)
              (local_478.super_Array<char16_t>.disposer,pcVar1,2,sVar2,sVar2,0);
  }
  return;
}

Assistant:

TEST(AsyncUnixTest, SignalWithValue) {
  // This tests that if we use sigqueue() to attach a value to the signal, that value is received
  // correctly.  Note that this only works on platforms that support real-time signals -- even
  // though the signal we're sending is SIGURG, the sigqueue() system call is introduced by RT
  // signals.  Hence this test won't run on e.g. Mac OSX.
  //
  // Also, Android's bionic does not appear to support sigqueue() even though the kernel does.
  //
  // Also, this test fails on Linux on mipsel. si_value comes back as zero. No one with a mips
  // machine wants to debug the problem but they demand a patch fixing it, so we disable the test.
  // Sad. https://github.com/sandstorm-io/capnproto/issues/204

  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  union sigval value;
  memset(&value, 0, sizeof(value));
  value.sival_int = 123;
  KJ_SYSCALL_HANDLE_ERRORS(sigqueue(getpid(), SIGURG, value)) {
    case ENOSYS:
      // sigqueue() not supported. Maybe running on WSL.
      KJ_LOG(WARNING, "sigqueue() is not implemented by your system; skipping test");
      return;
    default:
      KJ_FAIL_SYSCALL("sigqueue(getpid(), SIGURG, value)", error);
  }

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
  EXPECT_SI_CODE(SI_QUEUE, info.si_code);
  EXPECT_EQ(123, info.si_value.sival_int);
}